

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.h
# Opt level: O2

void __thiscall
ZAP::ArchiveBuilder::Entry::Entry(Entry *this,string *real_path,string *virtual_path)

{
  std::__cxx11::string::string((string *)this,(string *)real_path);
  std::__cxx11::string::string((string *)&this->virtual_path,(string *)virtual_path);
  return;
}

Assistant:

Entry(const std::string &real_path, const std::string &virtual_path)
				: real_path(real_path), virtual_path(virtual_path) {}